

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::texcoord3f>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *result)

{
  pointer ptVar1;
  StreamReader *pSVar2;
  bool bVar3;
  ulong uVar4;
  char c;
  texcoord3f value;
  
  ptVar1 = (result->
           super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>)
      ._M_impl.super__Vector_impl_data._M_finish != ptVar1) {
    (result->
    super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>).
    _M_impl.super__Vector_impl_data._M_finish = ptVar1;
  }
  bVar3 = SkipWhitespaceAndNewline(this,true);
  if (bVar3) {
    ReadBasicType(this,&value);
    ::std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
    push_back(result,&value);
    while (bVar3 = Eof(this), !bVar3) {
      bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar3) {
        return false;
      }
      bVar3 = Char1(this,&c);
      if (!bVar3) {
        return false;
      }
      if (c == sep) {
        bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar3) {
          return false;
        }
        bVar3 = LookChar1(this,(char *)&value);
        if (!bVar3) {
          return false;
        }
        if (value.s._0_1_ == end_symbol) break;
      }
      if (c != sep) {
        pSVar2 = this->_sr;
        if ((0 < (long)pSVar2->idx_) && (uVar4 = pSVar2->idx_ - 1, uVar4 <= pSVar2->length_)) {
          pSVar2->idx_ = uVar4;
        }
        break;
      }
      bVar3 = SkipWhitespaceAndNewline(this,true);
      if (!bVar3) {
        return false;
      }
      ReadBasicType(this,&value);
      ::std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
      push_back(result,&value);
    }
    if ((result->
        super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (result->
        super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    ::std::__cxx11::string::string((string *)&value,"Empty array.\n",(allocator *)&c);
    PushError(this,(string *)&value);
    ::std::__cxx11::string::_M_dispose();
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}